

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

QSqlError * qMakeError(QString *err,ErrorType type,QMYSQLDriverPrivate *p)

{
  int iVar1;
  long in_RCX;
  ErrorType in_EDX;
  QSqlError *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  char *cerr;
  QStringBuilder<QLatin1String,_const_QString_&> *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QByteArrayView *in_stack_ffffffffffffff20;
  QString *pQVar3;
  undefined8 local_c8;
  undefined1 local_90 [24];
  storage_type *local_78;
  undefined1 local_68 [24];
  QLatin1StringView local_50;
  QLatin1String local_40;
  undefined1 local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RCX + 0xa8) == 0) {
    local_c8 = 0;
  }
  else {
    local_c8 = mysql_error(*(undefined8 *)(in_RCX + 0xa8));
  }
  local_10 = local_c8;
  local_50 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        in_stack_ffffffffffffff10);
  operator+(&local_40,(QString *)in_stack_ffffffffffffff08);
  QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff08);
  QByteArrayView::QByteArrayView<const_char_*,_true>
            (in_stack_ffffffffffffff20,
             (char **)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QVar2.m_data = local_78;
  QVar2.m_size = (qsizetype)local_68;
  QString::fromUtf8(QVar2);
  iVar1 = mysql_errno(*(undefined8 *)(in_RCX + 0xa8));
  pQVar3 = (QString *)local_90;
  QString::number((uint)pQVar3,iVar1);
  QSqlError::QSqlError(in_RDI,(QString *)local_28,(QString *)local_68,in_EDX,pQVar3);
  QString::~QString((QString *)0x10c719);
  QString::~QString((QString *)0x10c723);
  QString::~QString((QString *)0x10c72d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QSqlError qMakeError(const QString &err, QSqlError::ErrorType type,
                            const QMYSQLDriverPrivate *p)
{
    const char *cerr = p->mysql ? mysql_error(p->mysql) : nullptr;
    return QSqlError("QMYSQL: "_L1 + err,
                     QString::fromUtf8(cerr),
                     type, QString::number(mysql_errno(p->mysql)));
}